

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepare.c
# Opt level: O3

int luv_new_prepare(lua_State *L)

{
  int iVar1;
  uv_prepare_t *handle;
  uv_loop_t *loop;
  luv_handle_t *plVar2;
  
  handle = (uv_prepare_t *)luv_newuserdata(L,0x78);
  loop = luv_loop(L);
  iVar1 = uv_prepare_init(loop,handle);
  if (iVar1 < 0) {
    lua_settop(L,-2);
    luv_error(L,iVar1);
    iVar1 = 3;
  }
  else {
    plVar2 = luv_setup_handle(L);
    handle->data = plVar2;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int luv_new_prepare(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  uv_prepare_t* handle = (uv_prepare_t*)luv_newuserdata(L, sizeof(*handle));
  int ret = uv_prepare_init(ctx->loop, handle);
  if (ret < 0) {
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  handle->data = luv_setup_handle(L, ctx);
  return 1;
}